

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_load.c
# Opt level: O1

int Load_EXT_framebuffer_object(void)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  
  _ptrc_glBindFramebufferEXT =
       (_func_void_GLenum_GLuint *)glXGetProcAddressARB("glBindFramebufferEXT");
  bVar8 = _ptrc_glBindFramebufferEXT == (_func_void_GLenum_GLuint *)0x0;
  _ptrc_glBindRenderbufferEXT =
       (_func_void_GLenum_GLuint *)glXGetProcAddressARB("glBindRenderbufferEXT");
  uVar1 = bVar8 + 1;
  if (_ptrc_glBindRenderbufferEXT != (_func_void_GLenum_GLuint *)0x0) {
    uVar1 = (uint)bVar8;
  }
  _ptrc_glCheckFramebufferStatusEXT =
       (_func_GLenum_GLenum *)glXGetProcAddressARB("glCheckFramebufferStatusEXT");
  bVar8 = _ptrc_glCheckFramebufferStatusEXT == (_func_GLenum_GLenum *)0x0;
  _ptrc_glDeleteFramebuffersEXT =
       (_func_void_GLsizei_GLuint_ptr *)glXGetProcAddressARB("glDeleteFramebuffersEXT");
  bVar9 = _ptrc_glDeleteFramebuffersEXT == (_func_void_GLsizei_GLuint_ptr *)0x0;
  _ptrc_glDeleteRenderbuffersEXT =
       (_func_void_GLsizei_GLuint_ptr *)glXGetProcAddressARB("glDeleteRenderbuffersEXT");
  bVar2 = _ptrc_glDeleteRenderbuffersEXT == (_func_void_GLsizei_GLuint_ptr *)0x0;
  _ptrc_glFramebufferRenderbufferEXT =
       (_func_void_GLenum_GLenum_GLenum_GLuint *)
       glXGetProcAddressARB("glFramebufferRenderbufferEXT");
  bVar10 = _ptrc_glFramebufferRenderbufferEXT == (_func_void_GLenum_GLenum_GLenum_GLuint *)0x0;
  _ptrc_glFramebufferTexture1DEXT =
       (_func_void_GLenum_GLenum_GLenum_GLuint_GLint *)
       glXGetProcAddressARB("glFramebufferTexture1DEXT");
  bVar3 = _ptrc_glFramebufferTexture1DEXT == (_func_void_GLenum_GLenum_GLenum_GLuint_GLint *)0x0;
  _ptrc_glFramebufferTexture2DEXT =
       (_func_void_GLenum_GLenum_GLenum_GLuint_GLint *)
       glXGetProcAddressARB("glFramebufferTexture2DEXT");
  bVar11 = _ptrc_glFramebufferTexture2DEXT == (_func_void_GLenum_GLenum_GLenum_GLuint_GLint *)0x0;
  _ptrc_glFramebufferTexture3DEXT =
       (_func_void_GLenum_GLenum_GLenum_GLuint_GLint_GLint *)
       glXGetProcAddressARB("glFramebufferTexture3DEXT");
  bVar4 = _ptrc_glFramebufferTexture3DEXT ==
          (_func_void_GLenum_GLenum_GLenum_GLuint_GLint_GLint *)0x0;
  _ptrc_glGenFramebuffersEXT =
       (_func_void_GLsizei_GLuint_ptr *)glXGetProcAddressARB("glGenFramebuffersEXT");
  bVar12 = _ptrc_glGenFramebuffersEXT == (_func_void_GLsizei_GLuint_ptr *)0x0;
  _ptrc_glGenRenderbuffersEXT =
       (_func_void_GLsizei_GLuint_ptr *)glXGetProcAddressARB("glGenRenderbuffersEXT");
  bVar5 = _ptrc_glGenRenderbuffersEXT == (_func_void_GLsizei_GLuint_ptr *)0x0;
  _ptrc_glGenerateMipmapEXT = (_func_void_GLenum *)glXGetProcAddressARB("glGenerateMipmapEXT");
  bVar13 = _ptrc_glGenerateMipmapEXT == (_func_void_GLenum *)0x0;
  _ptrc_glGetFramebufferAttachmentParameterivEXT =
       (_func_void_GLenum_GLenum_GLenum_GLint_ptr *)
       glXGetProcAddressARB("glGetFramebufferAttachmentParameterivEXT");
  bVar6 = _ptrc_glGetFramebufferAttachmentParameterivEXT ==
          (_func_void_GLenum_GLenum_GLenum_GLint_ptr *)0x0;
  _ptrc_glGetRenderbufferParameterivEXT =
       (_func_void_GLenum_GLenum_GLint_ptr *)glXGetProcAddressARB("glGetRenderbufferParameterivEXT")
  ;
  bVar14 = _ptrc_glGetRenderbufferParameterivEXT == (_func_void_GLenum_GLenum_GLint_ptr *)0x0;
  _ptrc_glIsFramebufferEXT = (_func_GLboolean_GLuint *)glXGetProcAddressARB("glIsFramebufferEXT");
  bVar7 = _ptrc_glIsFramebufferEXT == (_func_GLboolean_GLuint *)0x0;
  _ptrc_glIsRenderbufferEXT = (_func_GLboolean_GLuint *)glXGetProcAddressARB("glIsRenderbufferEXT");
  bVar15 = _ptrc_glIsRenderbufferEXT == (_func_GLboolean_GLuint *)0x0;
  _ptrc_glRenderbufferStorageEXT =
       (_func_void_GLenum_GLenum_GLsizei_GLsizei *)glXGetProcAddressARB("glRenderbufferStorageEXT");
  return (uint)bVar15 +
         (uint)bVar14 +
         (uint)bVar13 +
         (uint)bVar12 +
         (uint)bVar11 + (uint)bVar10 + (uint)bVar9 + uVar1 + bVar8 + (uint)bVar2 + (uint)bVar3 +
         (uint)bVar4 + (uint)bVar5 + (uint)bVar6 + (uint)bVar7 +
         (uint)(_ptrc_glRenderbufferStorageEXT == (_func_void_GLenum_GLenum_GLsizei_GLsizei *)0x0);
}

Assistant:

static int Load_EXT_framebuffer_object(void)
{
	int numFailed = 0;
	_ptrc_glBindFramebufferEXT = (void (CODEGEN_FUNCPTR *)(GLenum, GLuint))IntGetProcAddress("glBindFramebufferEXT");
	if(!_ptrc_glBindFramebufferEXT) numFailed++;
	_ptrc_glBindRenderbufferEXT = (void (CODEGEN_FUNCPTR *)(GLenum, GLuint))IntGetProcAddress("glBindRenderbufferEXT");
	if(!_ptrc_glBindRenderbufferEXT) numFailed++;
	_ptrc_glCheckFramebufferStatusEXT = (GLenum (CODEGEN_FUNCPTR *)(GLenum))IntGetProcAddress("glCheckFramebufferStatusEXT");
	if(!_ptrc_glCheckFramebufferStatusEXT) numFailed++;
	_ptrc_glDeleteFramebuffersEXT = (void (CODEGEN_FUNCPTR *)(GLsizei, const GLuint *))IntGetProcAddress("glDeleteFramebuffersEXT");
	if(!_ptrc_glDeleteFramebuffersEXT) numFailed++;
	_ptrc_glDeleteRenderbuffersEXT = (void (CODEGEN_FUNCPTR *)(GLsizei, const GLuint *))IntGetProcAddress("glDeleteRenderbuffersEXT");
	if(!_ptrc_glDeleteRenderbuffersEXT) numFailed++;
	_ptrc_glFramebufferRenderbufferEXT = (void (CODEGEN_FUNCPTR *)(GLenum, GLenum, GLenum, GLuint))IntGetProcAddress("glFramebufferRenderbufferEXT");
	if(!_ptrc_glFramebufferRenderbufferEXT) numFailed++;
	_ptrc_glFramebufferTexture1DEXT = (void (CODEGEN_FUNCPTR *)(GLenum, GLenum, GLenum, GLuint, GLint))IntGetProcAddress("glFramebufferTexture1DEXT");
	if(!_ptrc_glFramebufferTexture1DEXT) numFailed++;
	_ptrc_glFramebufferTexture2DEXT = (void (CODEGEN_FUNCPTR *)(GLenum, GLenum, GLenum, GLuint, GLint))IntGetProcAddress("glFramebufferTexture2DEXT");
	if(!_ptrc_glFramebufferTexture2DEXT) numFailed++;
	_ptrc_glFramebufferTexture3DEXT = (void (CODEGEN_FUNCPTR *)(GLenum, GLenum, GLenum, GLuint, GLint, GLint))IntGetProcAddress("glFramebufferTexture3DEXT");
	if(!_ptrc_glFramebufferTexture3DEXT) numFailed++;
	_ptrc_glGenFramebuffersEXT = (void (CODEGEN_FUNCPTR *)(GLsizei, GLuint *))IntGetProcAddress("glGenFramebuffersEXT");
	if(!_ptrc_glGenFramebuffersEXT) numFailed++;
	_ptrc_glGenRenderbuffersEXT = (void (CODEGEN_FUNCPTR *)(GLsizei, GLuint *))IntGetProcAddress("glGenRenderbuffersEXT");
	if(!_ptrc_glGenRenderbuffersEXT) numFailed++;
	_ptrc_glGenerateMipmapEXT = (void (CODEGEN_FUNCPTR *)(GLenum))IntGetProcAddress("glGenerateMipmapEXT");
	if(!_ptrc_glGenerateMipmapEXT) numFailed++;
	_ptrc_glGetFramebufferAttachmentParameterivEXT = (void (CODEGEN_FUNCPTR *)(GLenum, GLenum, GLenum, GLint *))IntGetProcAddress("glGetFramebufferAttachmentParameterivEXT");
	if(!_ptrc_glGetFramebufferAttachmentParameterivEXT) numFailed++;
	_ptrc_glGetRenderbufferParameterivEXT = (void (CODEGEN_FUNCPTR *)(GLenum, GLenum, GLint *))IntGetProcAddress("glGetRenderbufferParameterivEXT");
	if(!_ptrc_glGetRenderbufferParameterivEXT) numFailed++;
	_ptrc_glIsFramebufferEXT = (GLboolean (CODEGEN_FUNCPTR *)(GLuint))IntGetProcAddress("glIsFramebufferEXT");
	if(!_ptrc_glIsFramebufferEXT) numFailed++;
	_ptrc_glIsRenderbufferEXT = (GLboolean (CODEGEN_FUNCPTR *)(GLuint))IntGetProcAddress("glIsRenderbufferEXT");
	if(!_ptrc_glIsRenderbufferEXT) numFailed++;
	_ptrc_glRenderbufferStorageEXT = (void (CODEGEN_FUNCPTR *)(GLenum, GLenum, GLsizei, GLsizei))IntGetProcAddress("glRenderbufferStorageEXT");
	if(!_ptrc_glRenderbufferStorageEXT) numFailed++;
	return numFailed;
}